

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv_fa.c
# Opt level: O0

int isobusfs_srv_rx_cg_fa(isobusfs_srv_priv *priv,isobusfs_msg *msg)

{
  uint uVar1;
  ulong uVar2;
  isobusfs_srv_priv *in_RSI;
  isobusfs_msg *in_RDI;
  isobusfs_srv_priv *unaff_retaddr;
  int ret;
  int func;
  isobusfs_srv_priv *in_stack_00000028;
  isobusfs_srv_priv *in_stack_00000030;
  isobusfs_srv_priv *in_stack_00000038;
  int iVar3;
  
  uVar1 = isobusfs_buf_to_function((uint8_t *)in_RSI);
  iVar3 = 0;
  uVar2 = (ulong)uVar1;
  switch(uVar2) {
  case 0:
    iVar3 = isobusfs_srv_fa_open_file_req(in_stack_00000038,(isobusfs_msg *)in_stack_00000030);
    break;
  case 1:
    iVar3 = isobusfs_srv_fa_sf_req(in_stack_00000028,(isobusfs_msg *)priv);
    break;
  case 2:
    iVar3 = isobusfs_srv_fa_rf_req(in_stack_00000030,(isobusfs_msg *)in_stack_00000028);
    break;
  case 3:
  default:
    isobusfs_log(2,"%s: unsupported function: %i","isobusfs_srv_rx_cg_fa",uVar1);
    isobusfs_srv_send_error
              (in_RSI,(isobusfs_msg *)CONCAT44(uVar1,iVar3),(isobusfs_error)(uVar2 >> 0x20));
    break;
  case 4:
    iVar3 = isobusfs_srv_fa_cf_req(unaff_retaddr,in_RDI);
  }
  return iVar3;
}

Assistant:

int isobusfs_srv_rx_cg_fa(struct isobusfs_srv_priv *priv,
			  struct isobusfs_msg *msg)
{
	int func = isobusfs_buf_to_function(msg->buf);
	int ret = 0;

	switch (func) {
	case ISOBUSFS_FA_F_OPEN_FILE_REQ:
		ret = isobusfs_srv_fa_open_file_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_CLOSE_FILE_REQ:
		ret = isobusfs_srv_fa_cf_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_READ_FILE_REQ:
		ret = isobusfs_srv_fa_rf_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_SEEK_FILE_REQ:
		ret = isobusfs_srv_fa_sf_req(priv, msg);
		break;
	case ISOBUSFS_FA_F_WRITE_FILE_REQ: /* fall through */
	default:
		pr_warn("%s: unsupported function: %i", __func__, func);
		isobusfs_srv_send_error(priv, msg,
					ISOBUSFS_ERR_FUNC_NOT_SUPPORTED);
	}

	return ret;
}